

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  ushort uVar1;
  CType *pCVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  CType *ct;
  CTypeID id;
  uint32_t tmask_local;
  GCstr *name_local;
  CType **ctp_local;
  CTState *cts_local;
  
  uVar3 = (uint)name + 0xfb3ee249;
  uVar4 = uVar3 * 0x4000 | uVar3 >> 0x12;
  uVar5 = (uVar3 ^ (uint)name) - uVar4;
  uVar1 = cts->hash[(uVar5 ^ (uVar4 << 5 | uVar3 * 0x4000 >> 0x1b)) - (uVar5 >> 0x13) & 0x7f];
  while( true ) {
    id = (CTypeID)uVar1;
    if (id == 0) {
      *ctp = cts->tab;
      return 0;
    }
    pCVar2 = cts->tab + id;
    if (((GCstr *)(ulong)(pCVar2->name).gcptr32 == name) &&
       ((tmask >> (byte)(pCVar2->info >> 0x1c) & 1) != 0)) break;
    uVar1 = pCVar2->next;
  }
  *ctp = pCVar2;
  return id;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}